

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_sdl2.cpp
# Opt level: O2

void ImGui_ImplSDL2_CloseGamepads(void)

{
  int iVar1;
  _SDL_GameController **pp_Var2;
  ImGui_ImplSDL2_Data *pIVar3;
  long lVar4;
  
  pIVar3 = ImGui_ImplSDL2_GetBackendData();
  if (pIVar3->GamepadMode != ImGui_ImplSDL2_GamepadMode_Manual) {
    pp_Var2 = (pIVar3->Gamepads).Data;
    iVar1 = (pIVar3->Gamepads).Size;
    for (lVar4 = 0; (long)iVar1 * 8 != lVar4; lVar4 = lVar4 + 8) {
      SDL_GameControllerClose(*(undefined8 *)((long)pp_Var2 + lVar4));
    }
  }
  ImVector<_SDL_GameController_*>::resize(&pIVar3->Gamepads,0);
  return;
}

Assistant:

static void ImGui_ImplSDL2_CloseGamepads()
{
    ImGui_ImplSDL2_Data* bd = ImGui_ImplSDL2_GetBackendData();
    if (bd->GamepadMode != ImGui_ImplSDL2_GamepadMode_Manual)
        for (SDL_GameController* gamepad : bd->Gamepads)
            SDL_GameControllerClose(gamepad);
    bd->Gamepads.resize(0);
}